

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O1

void kv_init_var_test(void)

{
  btree_kv_ops *pbVar1;
  timeval __test_begin;
  char local_88 [16];
  char local_78 [16];
  timeval local_68;
  btree local_58;
  
  gettimeofday(&local_68,(__timezone_ptr_t)0x0);
  memleak_start();
  pbVar1 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  (*pbVar1->init_kv_var)(&local_58,(void *)0x0,(void *)0x0);
  local_58.vsize = '\b';
  (*pbVar1->init_kv_var)(&local_58,local_78,local_88);
  if (local_78[0] != '\0') {
    kv_init_var_test();
  }
  if (local_88[0] != '\0') {
    kv_init_var_test();
  }
  kv_init_var_test();
  return;
}

Assistant:

void kv_init_var_test()
{
    TEST_INIT();
    memleak_start();

    void *key, *value;
    btree_kv_ops *kv_ops = btree_str_kv_get_kb64_vb64(NULL);
    btree *tree = alca(struct btree, 1);
    uint8_t ksize = sizeof(void *);
    uint8_t vsize = 8;

    // unintialized key/value
    key = NULL;
    value = NULL;
    kv_ops->init_kv_var(tree, key, value);
    TEST_CHK(key == NULL);
    TEST_CHK(value == NULL);

    // initialized
    key = (void *)alca(uint8_t, ksize);
    value = (void *)alca(uint8_t, vsize);
    tree->vsize = vsize;
    kv_ops->init_kv_var(tree, key, value);
    TEST_CHK( *(uint8_t *)key == 0 );
    TEST_CHK( *(uint8_t *)value == 0 );

    free(kv_ops);
    memleak_end();
    TEST_RESULT("kv init var test");
}